

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall libtorrent::dh_key_exchange::dh_key_exchange(dh_key_exchange *this)

{
  pointer p;
  size_type l;
  iterator i;
  iterator j;
  difference_type extraout_RDX;
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  *mod;
  span<char> buffer;
  int local_16c;
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  type local_f8;
  span<char> local_80;
  undefined1 local_70 [8];
  array<std::uint8_t,_96> random_key;
  dh_key_exchange *this_local;
  
  random_key.super_array<unsigned_char,_96UL>._M_elems._88_8_ = this;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number(&this->m_dh_local_key);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number(&this->m_dh_local_secret);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number(&this->m_dh_shared_secret);
  digest32<160L>::digest32(&this->m_xor_mask);
  p = std::array<unsigned_char,_96UL>::data((array<unsigned_char,_96UL> *)local_70);
  l = std::array<unsigned_char,_96UL>::size((array<unsigned_char,_96UL> *)local_70);
  span<char>::span(&local_80,(char *)p,l);
  buffer.m_len = extraout_RDX;
  buffer.m_ptr = (char *)local_80.m_len;
  libtorrent::aux::random_bytes((aux *)local_80.m_ptr,buffer);
  i = std::array<unsigned_char,_96UL>::begin((array<unsigned_char,_96UL> *)local_70);
  j = std::array<unsigned_char,_96UL>::end((array<unsigned_char,_96UL> *)local_70);
  mod = (number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
         *)0x1;
  boost::multiprecision::
  import_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char>
            (&this->m_dh_local_secret,i,j,0,true);
  local_16c = 2;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<int>(&local_168,&local_16c,(type *)0x0);
  boost::multiprecision::
  powm<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_f8,(multiprecision *)&local_168,&this->m_dh_local_secret,
             (number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(anonymous_namespace)::dh_prime,mod);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator=(&this->m_dh_local_key,&local_f8);
  return;
}

Assistant:

dh_key_exchange::dh_key_exchange()
	{
		aux::array<std::uint8_t, 96> random_key;
		aux::random_bytes({reinterpret_cast<char*>(random_key.data())
			, static_cast<std::ptrdiff_t>(random_key.size())});

		// create local key (random)
		mp::import_bits(m_dh_local_secret, random_key.begin(), random_key.end());

		// key = (2 ^ secret) % prime
		m_dh_local_key = mp::powm(key_t(2), m_dh_local_secret, dh_prime);
	}